

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O2

ProgramContext * __thiscall
deqp::gles2::Performance::ShaderCompilerLoopCase::generateShaderData
          (ProgramContext *__return_storage_ptr__,ShaderCompilerLoopCase *this,int measurementNdx)

{
  int iVar1;
  LoopType LVar2;
  deUint32 cacheAvoidanceID;
  deUint32 id;
  int in_R9D;
  string nameSpec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  local_148;
  Vector<float,_16> local_130;
  string local_f0;
  UniformSpec local_d0;
  Vec4 local_68;
  Vec4 local_58;
  Vec4 local_48;
  Vec4 local_38;
  
  cacheAvoidanceID =
       ShaderCompilerCase::getSpecializationID(&this->super_ShaderCompilerCase,measurementNdx);
  getNameSpecialization_abi_cxx11_(&local_f0,(Performance *)(ulong)cacheAvoidanceID,id);
  (__return_storage_ptr__->vertShaderSource)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->vertShaderSource).field_2;
  (__return_storage_ptr__->vertShaderSource)._M_string_length = 0;
  (__return_storage_ptr__->vertShaderSource).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->fragShaderSource)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->fragShaderSource).field_2;
  (__return_storage_ptr__->fragShaderSource)._M_string_length = 0;
  (__return_storage_ptr__->fragShaderSource).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->vertexAttributes).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->vertexAttributes).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->vertexAttributes).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->uniforms).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->uniforms).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->uniforms).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  loopVertexTemplate_abi_cxx11_
            ((string *)&local_130,(Performance *)(ulong)this->m_type,(uint)this->m_isVertexCase,
             SUB41(this->m_numLoopIterations,0),this->m_nestingDepth,in_R9D);
  specializeShaderSource(&local_d0.name,(string *)&local_130,cacheAvoidanceID,SHADER_VALIDITY_VALID)
  ;
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_130);
  loopFragmentTemplate_abi_cxx11_
            ((string *)&local_130,(Performance *)(ulong)this->m_type,(uint)this->m_isVertexCase,
             SUB41(this->m_numLoopIterations,0),this->m_nestingDepth,in_R9D);
  specializeShaderSource(&local_d0.name,(string *)&local_130,cacheAvoidanceID,SHADER_VALIDITY_VALID)
  ;
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->fragShaderSource,(string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_130);
  iVar1 = this->m_numLoopIterations;
  LVar2 = this->m_type;
  local_148.
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::operator+(&local_168,"a_position",&local_f0);
  local_38.m_data[0] = -1.0;
  local_38.m_data[1] = -1.0;
  local_38.m_data[2] = 0.0;
  local_38.m_data[3] = 1.0;
  local_48.m_data[0] = -1.0;
  local_48.m_data[1] = 1.0;
  local_48.m_data[2] = 0.0;
  local_48.m_data[3] = 1.0;
  local_58.m_data[0] = 1.0;
  local_58.m_data[1] = -1.0;
  local_58.m_data[2] = 0.0;
  local_58.m_data[3] = 1.0;
  local_68.m_data[0] = 1.0;
  local_68.m_data[1] = 1.0;
  local_68.m_data[2] = 0.0;
  local_68.m_data[3] = 1.0;
  combineVec4ToVec16(&local_130,&local_38,&local_48,&local_58,&local_68);
  ShaderCompilerCase::AttribSpec::AttribSpec((AttribSpec *)&local_d0,&local_168,&local_130);
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>
            (&local_148,(AttribSpec *)&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_168);
  std::operator+(&local_168,"a_value",&local_f0);
  local_38.m_data[0] = 1.0;
  local_38.m_data[1] = 1.0;
  local_38.m_data[2] = 1.0;
  local_38.m_data[3] = 1.0;
  local_48.m_data[0] = 1.0;
  local_48.m_data[1] = 1.0;
  local_48.m_data[2] = 1.0;
  local_48.m_data[3] = 1.0;
  local_58.m_data[0] = 1.0;
  local_58.m_data[1] = 1.0;
  local_58.m_data[2] = 1.0;
  local_58.m_data[3] = 1.0;
  local_68.m_data[0] = 1.0;
  local_68.m_data[1] = 1.0;
  local_68.m_data[2] = 1.0;
  local_68.m_data[3] = 1.0;
  combineVec4ToVec16(&local_130,&local_38,&local_48,&local_58,&local_68);
  ShaderCompilerCase::AttribSpec::AttribSpec((AttribSpec *)&local_d0,&local_168,&local_130);
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>
            (&local_148,(AttribSpec *)&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_168);
  if (LVar2 == LOOP_TYPE_DYNAMIC) {
    std::operator+(&local_168,"a_loopBound",&local_f0);
    local_68.m_data[0] = (float)iVar1;
    local_38.m_data[1] = 0.0;
    local_38.m_data[2] = 0.0;
    local_38.m_data[3] = 0.0;
    local_48.m_data[1] = 0.0;
    local_48.m_data[2] = 0.0;
    local_48.m_data[3] = 0.0;
    local_58.m_data[1] = 0.0;
    local_58.m_data[2] = 0.0;
    local_58.m_data[3] = 0.0;
    local_68.m_data[1] = 0.0;
    local_68.m_data[2] = 0.0;
    local_68.m_data[3] = 0.0;
    local_58.m_data[0] = local_68.m_data[0];
    local_48.m_data[0] = local_68.m_data[0];
    local_38.m_data[0] = local_68.m_data[0];
    combineVec4ToVec16(&local_130,&local_38,&local_48,&local_58,&local_68);
    ShaderCompilerCase::AttribSpec::AttribSpec((AttribSpec *)&local_d0,&local_168,&local_130);
    std::
    vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
    ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>
              (&local_148,(AttribSpec *)&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_168);
  }
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ::_M_move_assign(&__return_storage_ptr__->vertexAttributes,&local_148);
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ::~vector(&local_148);
  iVar1 = this->m_numLoopIterations;
  local_168._M_dataplus._M_p = (pointer)0x0;
  local_168._M_string_length = 0;
  local_168.field_2._M_allocated_capacity = 0;
  if (this->m_type == LOOP_TYPE_UNIFORM) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130,
                   "u_loopBound",&local_f0);
    ShaderCompilerCase::UniformSpec::UniformSpec
              (&local_d0,(string *)&local_130,TYPE_FLOAT,(float)iVar1);
    std::
    vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
    ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>
              ((vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
                *)&local_168,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_130);
  }
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ::_M_move_assign(&__return_storage_ptr__->uniforms,&local_168);
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ::~vector((vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
             *)&local_168);
  std::__cxx11::string::~string((string *)&local_f0);
  return __return_storage_ptr__;
}

Assistant:

ShaderCompilerCase::ProgramContext ShaderCompilerLoopCase::generateShaderData (int measurementNdx) const
{
	deUint32		specID		= getSpecializationID(measurementNdx);
	string			nameSpec	= getNameSpecialization(specID);
	ProgramContext	result;

	result.vertShaderSource		= specializeShaderSource(loopVertexTemplate(m_type, m_isVertexCase, m_numLoopIterations, m_nestingDepth), specID, SHADER_VALIDITY_VALID);
	result.fragShaderSource		= specializeShaderSource(loopFragmentTemplate(m_type, m_isVertexCase, m_numLoopIterations, m_nestingDepth), specID, SHADER_VALIDITY_VALID);

	result.vertexAttributes		= loopShaderAttributes(nameSpec, m_type, m_numLoopIterations);
	result.uniforms				= loopShaderUniforms(nameSpec, m_type, m_numLoopIterations);

	return result;
}